

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::PrefixRemover::MaybeRemove_abi_cxx11_
          (string *__return_storage_ptr__,void *this,StringPiece str)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  ulong local_38;
  size_t j;
  size_t i;
  PrefixRemover *this_local;
  StringPiece str_local;
  
  str_local.ptr_ = (char *)str.length_;
  this_local = (PrefixRemover *)str.ptr_;
  j = 0;
  local_38 = 0;
  str_local.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  while( true ) {
    uVar2 = StringPiece::size((StringPiece *)&this_local);
    bVar5 = false;
    if (j < uVar2) {
      uVar2 = std::__cxx11::string::size();
      bVar5 = local_38 < uVar2;
    }
    if (!bVar5) break;
    cVar1 = StringPiece::operator[]((StringPiece *)&this_local,j);
    if (cVar1 != '_') {
      cVar1 = StringPiece::operator[]((StringPiece *)&this_local,j);
      cVar1 = ascii_tolower(cVar1);
      local_38 = local_38 + 1;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)this);
      if (cVar1 != *pcVar3) {
        StringPiece::as_string_abi_cxx11_(__return_storage_ptr__,(StringPiece *)&this_local);
        return __return_storage_ptr__;
      }
    }
    j = j + 1;
  }
  uVar2 = std::__cxx11::string::size();
  if (local_38 < uVar2) {
    StringPiece::as_string_abi_cxx11_(__return_storage_ptr__,(StringPiece *)&this_local);
    return __return_storage_ptr__;
  }
  while( true ) {
    uVar2 = StringPiece::size((StringPiece *)&this_local);
    bVar5 = false;
    if (j < uVar2) {
      cVar1 = StringPiece::operator[]((StringPiece *)&this_local,j);
      bVar5 = cVar1 == '_';
    }
    if (!bVar5) break;
    j = j + 1;
  }
  sVar4 = StringPiece::size((StringPiece *)&this_local);
  if (j == sVar4) {
    StringPiece::as_string_abi_cxx11_(__return_storage_ptr__,(StringPiece *)&this_local);
    return __return_storage_ptr__;
  }
  StringPiece::remove_prefix((StringPiece *)&this_local,j);
  StringPiece::as_string_abi_cxx11_(__return_storage_ptr__,(StringPiece *)&this_local);
  return __return_storage_ptr__;
}

Assistant:

string MaybeRemove(StringPiece str) {
    // We can't just lowercase and strip str and look for a prefix.
    // We need to properly recognize the difference between:
    //
    //   enum Foo {
    //     FOO_BAR_BAZ = 0;
    //     FOO_BARBAZ = 1;
    //   }
    //
    // This is acceptable (though perhaps not advisable) because even when
    // we PascalCase, these two will still be distinct (BarBaz vs. Barbaz).
    size_t i, j;

    // Skip past prefix_ in str if we can.
    for (i = 0, j = 0; i < str.size() && j < prefix_.size(); i++) {
      if (str[i] == '_') {
        continue;
      }

      if (ascii_tolower(str[i]) != prefix_[j++]) {
        return str.as_string();
      }
    }

    // If we didn't make it through the prefix, we've failed to strip the
    // prefix.
    if (j < prefix_.size()) {
      return str.as_string();
    }

    // Skip underscores between prefix and further characters.
    while (i < str.size() && str[i] == '_') {
      i++;
    }

    // Enum label can't be the empty string.
    if (i == str.size()) {
      return str.as_string();
    }

    // We successfully stripped the prefix.
    str.remove_prefix(i);
    return str.as_string();
  }